

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::clearWorkspace(Compiler *this)

{
  Own<capnp::compiler::Compiler::Impl> *this_00;
  Impl *this_01;
  Compiler *local_10;
  Compiler *this_local;
  
  local_10 = this;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>_> *)&stack0xffffffffffffffe0);
  this_00 = kj::Locked<kj::Own<capnp::compiler::Compiler::Impl>_>::operator->
                      ((Locked<kj::Own<capnp::compiler::Compiler::Impl>_> *)&stack0xffffffffffffffe0
                      );
  this_01 = kj::Own<capnp::compiler::Compiler::Impl>::get(this_00);
  Impl::clearWorkspace(this_01);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl>_> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void Compiler::clearWorkspace() const {
  impl.lockExclusive()->get()->clearWorkspace();
}